

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int av1_get_palette_delta_bits_v(PALETTE_MODE_INFO *pmi,int bit_depth,int *zero_count,int *min_bits)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  bVar1 = pmi->palette_size[1];
  *min_bits = bit_depth + -4;
  *zero_count = 0;
  iVar6 = 0;
  uVar3 = 0;
  for (lVar7 = 0x11; lVar7 - 0x10U < (ulong)bVar1; lVar7 = lVar7 + 1) {
    iVar8 = (uint)pmi->palette_colors[lVar7] - (uint)pmi->palette_colors[lVar7 + -1];
    uVar2 = (ushort)iVar8;
    uVar4 = -uVar2;
    if (0 < iVar8) {
      uVar4 = uVar2;
    }
    uVar5 = (1 << ((byte)bit_depth & 0x1f)) - (uint)uVar4;
    if ((int)(uint)uVar4 < (int)uVar5) {
      uVar5 = (uint)uVar4;
    }
    if ((int)uVar3 < (int)uVar5) {
      uVar3 = uVar5;
    }
    if (uVar5 == 0) {
      iVar6 = iVar6 + 1;
      *zero_count = iVar6;
    }
  }
  uVar5 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  iVar6 = 0;
  if (0 < (int)uVar3) {
    iVar6 = (uVar5 ^ 0xffffffe0) + 0x21;
  }
  if (iVar6 <= *min_bits) {
    iVar6 = *min_bits;
  }
  return iVar6;
}

Assistant:

int av1_get_palette_delta_bits_v(const PALETTE_MODE_INFO *const pmi,
                                 int bit_depth, int *zero_count,
                                 int *min_bits) {
  const int n = pmi->palette_size[1];
  const int max_val = 1 << bit_depth;
  int max_d = 0;
  *min_bits = bit_depth - 4;
  *zero_count = 0;
  for (int i = 1; i < n; ++i) {
    const int delta = pmi->palette_colors[2 * PALETTE_MAX_SIZE + i] -
                      pmi->palette_colors[2 * PALETTE_MAX_SIZE + i - 1];
    const int v = abs(delta);
    const int d = AOMMIN(v, max_val - v);
    if (d > max_d) max_d = d;
    if (d == 0) ++(*zero_count);
  }
  return AOMMAX(av1_ceil_log2(max_d + 1), *min_bits);
}